

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.c
# Opt level: O2

int cmsysString_strncasecmp(char *lhs,char *rhs,size_t n)

{
  int iVar1;
  
  iVar1 = strncasecmp(lhs,rhs,n);
  return iVar1;
}

Assistant:

int kwsysString_strncasecmp(const char* lhs, const char* rhs, size_t n)
{
#if defined(KWSYS_STRING_USE_STRICMP)
  return _strnicmp(lhs, rhs, n);
#elif defined(KWSYS_STRING_USE_STRCASECMP)
  return strncasecmp(lhs, rhs, n);
#else
  const char* const lower = kwsysString_strcasecmp_tolower;
  unsigned char const* us1 = (unsigned char const*)lhs;
  unsigned char const* us2 = (unsigned char const*)rhs;
  int result = 0;
  while (n && (result = lower[*us1] - lower[*us2++], result == 0) && *us1++) {
    --n;
  }
  return result;
#endif
}